

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::InvokeDefaultDelegate(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *dest)

{
  SQObjectType SVar1;
  bool bVar2;
  long lVar3;
  
  SVar1 = (self->super_SQObject)._type;
  if ((int)SVar1 < 0x8000200) {
    if ((int)SVar1 < 0x8000010) {
      if (((SVar1 != OT_BOOL) && (SVar1 != OT_INTEGER)) && (SVar1 != OT_FLOAT)) {
        return false;
      }
      lVar3 = 0xd8;
      goto LAB_0012581e;
    }
    if (SVar1 == OT_STRING) {
      lVar3 = 200;
      goto LAB_0012581e;
    }
    if (SVar1 == OT_ARRAY) {
      lVar3 = 0xb8;
      goto LAB_0012581e;
    }
    if (SVar1 != OT_CLOSURE) {
      return false;
    }
  }
  else {
    if (0x8003fff < (int)SVar1) {
      if ((int)SVar1 < 0xa000020) {
        lVar3 = 0x118;
        if (SVar1 != OT_CLASS) {
          if (SVar1 != OT_WEAKREF) {
            return false;
          }
          lVar3 = 0x138;
        }
      }
      else if (SVar1 == OT_INSTANCE) {
        lVar3 = 0x128;
      }
      else {
        if (SVar1 != OT_TABLE) {
          return false;
        }
        lVar3 = 0xa8;
      }
      goto LAB_0012581e;
    }
    if (SVar1 != OT_NATIVECLOSURE) {
      if (SVar1 == OT_GENERATOR) {
        lVar3 = 0xe8;
      }
      else {
        if (SVar1 != OT_THREAD) {
          return false;
        }
        lVar3 = 0x108;
      }
      goto LAB_0012581e;
    }
  }
  lVar3 = 0xf8;
LAB_0012581e:
  bVar2 = SQTable::Get(*(SQTable **)((long)&this->_sharedstate->_metamethods + lVar3),key,dest);
  return bVar2;
}

Assistant:

bool SQVM::InvokeDefaultDelegate(const SQObjectPtr &self,const SQObjectPtr &key,SQObjectPtr &dest)
{
    SQTable *ddel = NULL;
    switch(sq_type(self)) {
        case OT_CLASS: ddel = _class_ddel; break;
        case OT_TABLE: ddel = _table_ddel; break;
        case OT_ARRAY: ddel = _array_ddel; break;
        case OT_STRING: ddel = _string_ddel; break;
        case OT_INSTANCE: ddel = _instance_ddel; break;
        case OT_INTEGER:case OT_FLOAT:case OT_BOOL: ddel = _number_ddel; break;
        case OT_GENERATOR: ddel = _generator_ddel; break;
        case OT_CLOSURE: case OT_NATIVECLOSURE: ddel = _closure_ddel; break;
        case OT_THREAD: ddel = _thread_ddel; break;
        case OT_WEAKREF: ddel = _weakref_ddel; break;
        default: return false;
    }
    return  ddel->Get(key,dest);
}